

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::DiffuseTransmissionMaterial::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DiffuseTransmissionMaterial *this)

{
  FloatTextureHandle *unaff_RBX;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ DiffuseTransmissionMaterial displacment: %s reflectance: %s transmittance: %s sigma: %s ]"
             ,(char *)this,(FloatTextureHandle *)&this->reflectance,&this->transmittance,
             (SpectrumTextureHandle *)&this->sigma,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string DiffuseTransmissionMaterial::ToString() const {
    return StringPrintf("[ DiffuseTransmissionMaterial displacment: %s reflectance: %s "
                        "transmittance: %s sigma: %s ]",
                        displacement, reflectance, transmittance, sigma);
}